

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

Type * __thiscall LLVMBC::Type::getStructElementType(Type *this,uint index)

{
  StructType *this_00;
  Type *pTVar1;
  uint index_local;
  Type *this_local;
  
  if (this->type_id == StructTyID) {
    this_00 = cast<LLVMBC::StructType>(this);
    pTVar1 = StructType::getElementType(this_00,index);
    return pTVar1;
  }
  __assert_fail("type_id == TypeID::StructTyID",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/bc/type.cpp"
                ,0x9c,"Type *LLVMBC::Type::getStructElementType(unsigned int) const");
}

Assistant:

Type *Type::getStructElementType(unsigned index) const
{
	assert(type_id == TypeID::StructTyID);
	return cast<StructType>(this)->getElementType(index);
}